

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::util_reportModelMPS(HModel *this,char *filename)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  char buff [55];
  ofstream output;
  char local_268 [56];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,filename,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"NAME",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,(this->modelName)._M_dataplus._M_p,
                      (this->modelName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," SIZE: N=",9);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->numCol);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",  M=",5);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->numRow);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", NZ=",5);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  local_268[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_268,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"ROWS\n",5);
  if (0 < this->numRow) {
    iVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," E  R",5);
      iVar8 = iVar8 + 1;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    } while (iVar8 < this->numRow);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," N  COST",8);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"COLUMNS\n",8);
  *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 10;
  if (0 < (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[this->numCol]) {
    bVar3 = true;
    bVar4 = true;
    iVar8 = 0;
    uVar7 = 0;
    do {
      uVar1 = uVar7 + 1;
      if (iVar8 < (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7 + 1]) {
        lVar9 = (long)iVar8;
        do {
          bVar3 = !bVar3;
          if (bVar3) {
            sprintf(local_268,"        R%-3d %12f",
                    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar9],
                    (ulong)((this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar9] + 1));
            sVar6 = strlen(local_268);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,local_268,sVar6);
            std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)&local_230);
            std::ostream::put((char)&local_230);
            std::ostream::flush();
          }
          else {
            sprintf(local_268,"    C%-3d      R%-3d %12f",
                    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar9],uVar1 & 0xffffffff);
            sVar6 = strlen(local_268);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,local_268,sVar6);
          }
          lVar9 = lVar9 + 1;
          iVar8 = iVar8 + 1;
          bVar4 = bVar3;
        } while (lVar9 < (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar1]);
      }
      if (!bVar4) {
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)&local_230);
        std::ostream::put((char)&local_230);
        bVar3 = true;
        bVar4 = true;
        std::ostream::flush();
      }
      if ((this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] != 0.0) {
        sprintf(local_268,"    C%-3d      COST %12f",uVar1 & 0xffffffff);
        sVar6 = strlen(local_268);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_268,sVar6);
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)&local_230);
        std::ostream::put((char)&local_230);
        std::ostream::flush();
      }
      uVar7 = uVar1;
    } while (iVar8 < (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[this->numCol]);
  }
  *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"RHS\n",4);
  if (0 < this->numRow) {
    bVar3 = true;
    lVar9 = 0;
    do {
      cVar2 = (char)(ostream *)&local_230;
      if ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] != 0.0) {
        if (bVar3) {
          sprintf(local_268,"    DEMANDS   R%-3d %12g",lVar9 + 1);
          sVar6 = strlen(local_268);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_268,sVar6);
          bVar3 = false;
        }
        else {
          sprintf(local_268,"        R%-3d %12g",lVar9 + 1);
          sVar6 = strlen(local_268);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_268,sVar6);
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
          std::ostream::put(cVar2);
          bVar3 = true;
          std::ostream::flush();
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->numRow);
    if (!bVar3) {
      std::ios::widen(cVar2 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"BOUNDS\n",7);
  if (0 < this->numCol) {
    lVar9 = 0;
    do {
      if ((this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] < 1e+200) {
        sprintf(local_268,"  UP BND     C%-3d %12g\n",(ulong)((int)lVar9 + 1));
        sVar6 = strlen(local_268);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_268,sVar6);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->numCol);
  }
  if (0 < this->numCol) {
    lVar9 = 0;
    do {
      if ((this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] != 0.0) {
        sprintf(local_268,"  LO BND     C%-3d %12g\n",(ulong)((int)lVar9 + 1));
        sVar6 = strlen(local_268);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_268,sVar6);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->numCol);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"ENDATA",6);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void HModel::util_reportModelMPS(const char *filename) {
  ofstream output(filename);
  //COLUMNS are numCol + #constr with upper bound + #constr with lower bound: numColU and numColL
  output<<"NAME"<<"\t"<<modelName<<" SIZE: N="<<numCol<<",  M="<<numRow<<", NZ="<<Aindex.size()<<'\n';	

  output << "ROWS\n";
  for (int i = 1; i <= numRow; i++) {
    output << " E  R"<< i << "\n";
  }
  output << " N  COST"<<endl;
  output <<"COLUMNS\n";
  output << setprecision(10);
  
  char buff [55];
  
  int j=0; //element index
  int k=0; //column index
  bool ll=true;
  while (j<Astart[numCol]) {
    while (j<Astart[k+1]) {
      if (ll) {
	sprintf(buff, "    C%-3d      R%-3d %12f", k+1,  Aindex[j]+1, Avalue[j]);
	output<<buff;
	ll = false;
	j++;
      }
      else {
	sprintf(buff, "        R%-3d %12f", Aindex[j]+1, Avalue[j]);
	output<<buff<<endl;
	ll=true;
	j++;					
      }
    }
    if (!ll) {
      output<<endl;
      ll = true;
    }
    if (fabs(colCost[k])>0) {
      sprintf(buff, "    C%-3d      COST %12f", k+1,  colCost[k]);
      output<<buff<<endl;
    }
    k++;
  }
  
  output << setprecision(10);
  output <<"RHS\n"; //RHS for all cases
  ll = true;
  for (int i=0;i<numRow;i++) 
    if (fabs(rowUpper[i])>0) {
      if (ll) {
	sprintf(buff,"    DEMANDS   R%-3d %12g", i+1, rowUpper[i]);
	output<<buff;
	ll = false;
      }
      else {
	sprintf(buff,"        R%-3d %12g", i+1, rowUpper[i]);
	output<<buff<<endl;
	ll=true;					
      }
    }
  
  
  if (!ll)
    output<<endl;
  //omega and gamma by default have lb 0 and ub infinity, edit in future if needed
  output <<"BOUNDS\n";
  for (int i=0;i<numCol;i++) 
    if (colUpper[i]<HSOL_CONST_INF)  {
      sprintf(buff,"  UP BND     C%-3d %12g\n", i+1, colUpper[i]);
      output<<buff;
    }
  
  
  for (int i=0;i<numCol;i++) 
    if (fabs(colLower[i])>0) {
      sprintf(buff,"  LO BND     C%-3d %12g\n", i+1, colLower[i]);
      output<<buff;
    }
  
  output <<"ENDATA";
  
  output.close();
}